

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O1

int main(int32 argc,char **argv)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  cmd_ln_t *config;
  char *pcVar5;
  cmd_ln_t *config_00;
  ps_decoder_t *ps;
  char *pcVar6;
  FILE *pFVar7;
  FILE *pFVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ps_mllr_t *mllr;
  ps_mllr_t *ppVar14;
  logmath_t *lmath;
  fsg_model_t *fsg;
  ps_seg_t *itor;
  long lVar15;
  FILE *__stream;
  FILE *stream;
  FILE *__stream_00;
  double dVar16;
  size_t len;
  double n_wall;
  double n_cpu;
  double n_speech;
  char *wptr [4];
  uint local_144;
  uint local_12c;
  FILE *local_128;
  FILE *local_120;
  char *local_118;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  size_t local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  long local_b0;
  long local_a8;
  char *local_a0;
  long local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  long local_70;
  FILE *local_68;
  FILE *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  config = cmd_ln_parse_r((ps_config_t *)0x0,ps_args_def,argc,argv,1);
  config_00 = (cmd_ln_t *)0x0;
  if ((config != (cmd_ln_t *)0x0) &&
     (pcVar5 = ps_config_str(config,"argfile"), config_00 = config, pcVar5 != (char *)0x0)) {
    config_00 = cmd_ln_parse_file_r(config,ps_args_def,pcVar5,0);
  }
  if (config_00 == (cmd_ln_t *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,ps_args_def);
    return 1;
  }
  pcVar5 = ps_config_str(config_00,"ctl");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "-ctl argument not present, nothing to do in batch mode!\n";
    lVar15 = 0x3a8;
LAB_0010848c:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,lVar15,pcVar5);
LAB_00108498:
    exit(1);
  }
  local_110 = fopen(pcVar5,"r");
  if (local_110 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x3ab,"Failed to open control file \'%s\'",pcVar5);
    goto LAB_00108498;
  }
  ps_default_search_args(config_00);
  ps = ps_init(config_00);
  if (ps == (ps_decoder_t *)0x0) {
    ps_config_free(config_00);
    fclose(local_110);
    pcVar5 = "PocketSphinx decoder init failed\n";
    lVar15 = 0x3b2;
    goto LAB_0010848c;
  }
  local_98 = ps_config_int(config_00,"ctloffset");
  local_a8 = ps_config_int(config_00,"ctlcount");
  local_b0 = ps_config_int(config_00,"ctlincr");
  local_b8 = ps_config_str(config_00,"outlatdir");
  pcVar5 = ps_config_str(config_00,"nbestdir");
  local_70 = ps_config_int(config_00,"frate");
  pcVar6 = ps_config_str(config_00,"mllrctl");
  if (pcVar6 == (char *)0x0) {
    pFVar7 = (FILE *)0x0;
LAB_001077f6:
    pcVar6 = ps_config_str(config_00,"fsgctl");
    if (pcVar6 == (char *)0x0) {
      pFVar8 = (FILE *)0x0;
    }
    else {
      pFVar8 = fopen(pcVar6,"r");
      if (pFVar8 == (FILE *)0x0) {
        pcVar5 = "Failed to open FSG control file file %s";
        lVar15 = 0x2c9;
        goto LAB_00107890;
      }
    }
    local_68 = pFVar8;
    pcVar6 = ps_config_str(config_00,"alignctl");
    if (pcVar6 == (char *)0x0) {
      local_108 = (FILE *)0x0;
    }
    else {
      local_108 = fopen(pcVar6,"r");
      if (local_108 == (FILE *)0x0) {
        pcVar5 = "Failed to open alignment control file file %s";
        lVar15 = 0x2d0;
        goto LAB_00107890;
      }
    }
    pcVar6 = ps_config_str(config_00,"lmnamectl");
    if (pcVar6 == (char *)0x0) {
      pFVar8 = (FILE *)0x0;
LAB_001078f6:
      local_60 = pFVar8;
      pcVar6 = ps_config_str(config_00,"hyp");
      if (pcVar6 == (char *)0x0) {
        local_128 = (FILE *)0x0;
      }
      else {
        pFVar8 = fopen(pcVar6,"w");
        if (pFVar8 == (FILE *)0x0) {
          pcVar5 = "Failed to open hypothesis file %s for writing";
          lVar15 = 0x2de;
          goto LAB_001079eb;
        }
        local_128 = pFVar8;
        setbuf(pFVar8,(char *)0x0);
      }
      pcVar6 = ps_config_str(config_00,"hypseg");
      if (pcVar6 == (char *)0x0) {
        local_120 = (FILE *)0x0;
      }
      else {
        pFVar8 = fopen(pcVar6,"w");
        if (pFVar8 == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x2e6,"Failed to open hypothesis file %s for writing",pcVar6);
          pFVar8 = local_128;
          __stream = (FILE *)0x0;
          __stream_00 = (FILE *)0x0;
          goto LAB_001083c8;
        }
        local_120 = pFVar8;
        setbuf(pFVar8,(char *)0x0);
      }
      pcVar6 = ps_config_str(config_00,"ctm");
      if (pcVar6 == (char *)0x0) {
        local_100 = (FILE *)0x0;
      }
      else {
        pFVar8 = fopen(pcVar6,"w");
        if (pFVar8 == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x2ee,"Failed to open hypothesis file %s for writing",pcVar6);
          pFVar8 = local_128;
          __stream = local_120;
          __stream_00 = (FILE *)0x0;
          goto LAB_001083c8;
        }
        local_100 = pFVar8;
        setbuf(pFVar8,(char *)0x0);
      }
      local_cc = (int)local_98 + (int)local_a8;
      local_144 = 0;
      stream = local_110;
      local_88 = pcVar5;
      do {
        pcVar5 = fread_line((FILE *)stream,&local_f8);
        if (pcVar5 == (char *)0x0) {
          ps_get_all_time(ps,&local_e0,&local_e8,&local_f0);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x382,"TOTAL %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",local_e0
                  ,local_e8,local_f0);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,900,"AVERAGE %.2f xRT (CPU), %.2f xRT (elapsed)\n",local_e8 / local_e0,
                  local_f0 / local_e0);
          pFVar8 = local_128;
          __stream = local_120;
          __stream_00 = local_100;
          break;
        }
        if (pFVar7 == (FILE *)0x0) {
          local_90 = (char *)0x0;
          pcVar6 = (char *)0x0;
LAB_00107aa2:
          if (local_60 == (FILE *)0x0) {
            pcVar9 = (char *)0x0;
            pcVar10 = (char *)0x0;
LAB_00107add:
            if (local_68 == (FILE *)0x0) {
              local_a0 = (char *)0x0;
              pcVar11 = (char *)0x0;
            }
            else {
              pcVar11 = fread_line((FILE *)local_68,&local_f8);
              if (pcVar11 == (char *)0x0) {
                lVar15 = 0x313;
                pcVar6 = "File size mismatch between control and FSG control\n";
                goto LAB_00107d98;
              }
              local_a0 = pcVar11;
              pcVar11 = string_trim(pcVar11,STRING_BOTH);
            }
            if (local_108 == (FILE *)0x0) {
              pcVar12 = (char *)0x0;
              pcVar13 = (char *)0x0;
              local_118 = pcVar11;
            }
            else {
              pcVar12 = fread_line((FILE *)local_108,&local_f8);
              if (pcVar12 == (char *)0x0) {
                lVar15 = 0x31d;
                pcVar6 = "File size mismatch between control and align control\n";
                goto LAB_00107d98;
              }
              local_118 = pcVar11;
              pcVar13 = string_trim(pcVar12,STRING_BOTH);
            }
            if ((int)local_144 < (int)local_98) {
              local_144 = local_144 + (int)local_b0;
            }
            else if (((int)local_a8 == -1) || ((int)local_144 < local_cc)) {
              local_80 = pcVar12;
              local_78 = pcVar9;
              iVar2 = str2words(pcVar5,&local_58,4);
              if (iVar2 != 0) {
                if (-1 < iVar2) {
                  local_c0 = local_58;
                  iVar3 = 0;
                  if (1 < iVar2) {
                    iVar3 = atoi(local_50);
                  }
                  iVar4 = -1;
                  local_d0 = iVar3;
                  local_c8 = pcVar13;
                  if (2 < iVar2) {
                    iVar4 = atoi(local_48);
                  }
                  pcVar9 = local_c0;
                  if (3 < iVar2) {
                    pcVar9 = local_40;
                  }
                  local_d4 = iVar4;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x344,"Decoding \'%s\'\n",pcVar9);
                  pcVar11 = process_mllrctl_line_lastfile;
                  if ((pcVar6 == (char *)0x0) ||
                     ((process_mllrctl_line_lastfile != (char *)0x0 &&
                      (iVar3 = strcmp(pcVar6,process_mllrctl_line_lastfile), iVar3 == 0)))) {
LAB_00107ebe:
                    if (pcVar10 == (char *)0x0) {
LAB_00107f22:
                      pcVar6 = ps_config_str(config_00,"fsgdir");
                      pcVar10 = ps_config_str(config_00,"fsgext");
                      if (local_118 != (char *)0x0) {
                        if (pcVar6 == (char *)0x0) {
                          if (pcVar10 == (char *)0x0) {
                            pcVar11 = __ckd_salloc__(local_118,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                                  ,0x12f);
                          }
                          else {
                            pcVar11 = string_join(local_118,pcVar10,0);
                          }
                        }
                        else {
                          if (pcVar10 == (char *)0x0) {
                            pcVar10 = "";
                          }
                          pcVar11 = string_join(pcVar6,"/",local_118,pcVar10,0);
                        }
                        lmath = ps_get_logmath(ps);
                        dVar16 = ps_config_float(config_00,"lw");
                        fsg = fsg_model_readfile(pcVar11,lmath,(float32)(float)dVar16);
                        if ((fsg == (fsg_model_t *)0x0) ||
                           (iVar3 = ps_add_fsg(ps,local_118,fsg), pcVar6 = local_118, iVar3 != 0)) {
                          fsg_model_free(fsg);
                          goto LAB_00108012;
                        }
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x13d,"Using FSG: %s\n",local_118);
                        iVar3 = ps_activate_search(ps,pcVar6);
                        fsg_model_free(fsg);
                        ckd_free(pcVar11);
                        if (iVar3 != 0) goto LAB_0010801f;
                      }
                      iVar3 = process_alignctl_line(ps,config_00,local_c8);
                      if ((-1 < iVar3) &&
                         (iVar3 = process_ctl_line(ps,config_00,local_c0,pcVar9,local_d0,local_d4),
                         pFVar8 = local_120, -1 < iVar3)) {
                        if (local_128 == (FILE *)0x0) {
                          pcVar6 = (char *)0x0;
                        }
                        else if (local_c8 == (char *)0x0) {
                          pcVar6 = ps_get_hyp(ps,(int32 *)&local_12c);
                          pcVar10 = pcVar6;
                          if (pcVar6 == (char *)0x0) {
                            pcVar10 = "";
                          }
                          fprintf(local_128,"%s (%s %d)\n",pcVar10,pcVar9,(ulong)local_12c);
                        }
                        else {
                          pcVar6 = get_align_hyp(ps,(int *)&local_12c);
                          fprintf(local_128,"%s (%s %d)\n",pcVar6,pcVar9,(ulong)local_12c);
                          ckd_free(pcVar6);
                          pcVar6 = (char *)0x0;
                        }
                        pcVar10 = local_b8;
                        if (pFVar8 != (FILE *)0x0) {
                          write_hypseg((FILE *)pFVar8,ps,pcVar9);
                        }
                        pFVar8 = local_100;
                        if (local_100 != (FILE *)0x0) {
                          itor = ps_seg_iter(ps);
                          pcVar10 = local_b8;
                          write_ctm((FILE *)pFVar8,ps,itor,pcVar9,(int32)local_70);
                        }
                        if (pcVar10 != (char *)0x0) {
                          write_lattice(ps,pcVar10,pcVar9);
                        }
                        if (local_88 != (char *)0x0) {
                          write_nbest(ps,local_88,pcVar9);
                        }
                        ps_get_utt_time(ps,&local_e0,&local_e8,&local_f0);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x370,
                                "%s: %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",
                                local_e0,local_e8,local_f0,pcVar9);
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x372,"%s: %.2f xRT (CPU), %.2f xRT (elapsed)\n",
                                local_e8 / local_e0,local_f0 / local_e0,pcVar9);
                        if (pcVar6 == (char *)0x0) {
                          pcVar6 = "";
                        }
                        err_msg(ERR_INFO,(char *)0x0,0,"%s (%s %d)\n",pcVar6,pcVar9,local_12c);
                        err_msg(ERR_INFO,(char *)0x0,0,
                                "%s done --------------------------------------\n",pcVar9);
                        goto LAB_00107dd6;
                      }
                    }
                    else {
                      err_msg(ERR_INFO,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                              ,0x14f,"Using language model: %s\n",pcVar10);
                      iVar3 = ps_activate_search(ps,pcVar10);
                      if (iVar3 == 0) goto LAB_00107f22;
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                              ,0x151,"No such language model: %s\n",pcVar10);
                    }
                  }
                  else {
                    ckd_free(pcVar11);
                    process_mllrctl_line_lastfile =
                         __ckd_salloc__(pcVar6,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                        ,0x104);
                    pcVar11 = ps_config_str(config_00,"mllrext");
                    pcVar12 = ps_config_str(config_00,"mllrdir");
                    if (pcVar12 == (char *)0x0) {
                      if (pcVar11 == (char *)0x0) {
                        pcVar11 = __ckd_salloc__(pcVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                                 ,0x10d);
                      }
                      else {
                        pcVar11 = string_join(pcVar6,pcVar11,0);
                      }
                    }
                    else {
                      if (pcVar11 == (char *)0x0) {
                        pcVar11 = "";
                      }
                      pcVar11 = string_join(pcVar12,"/",pcVar6,pcVar11,0);
                    }
                    mllr = ps_mllr_read(pcVar11);
                    if (mllr != (ps_mllr_t *)0x0) {
                      ppVar14 = ps_update_mllr(ps,mllr);
                      if (ppVar14 != (ps_mllr_t *)0x0) {
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x119,"Using MLLR: %s\n",pcVar6);
                        ckd_free(pcVar11);
                        goto LAB_00107ebe;
                      }
                      ps_mllr_free(mllr);
                    }
LAB_00108012:
                    ckd_free(pcVar11);
                  }
LAB_0010801f:
                  bVar1 = false;
                  stream = local_110;
                  goto LAB_00107e30;
                }
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x334,"Unexpected extra data in control file at line %d\n",(ulong)local_144
                       );
              }
LAB_00107dd6:
              local_144 = local_144 + (int)local_b0;
              pcVar12 = local_80;
              pcVar9 = local_78;
              stream = local_110;
            }
            ckd_free(pcVar12);
            ckd_free(local_90);
            ckd_free(local_a0);
            ckd_free(pcVar9);
            ckd_free(pcVar5);
            bVar1 = false;
          }
          else {
            pcVar9 = fread_line((FILE *)local_60,&local_f8);
            if (pcVar9 != (char *)0x0) {
              pcVar10 = string_trim(pcVar9,STRING_BOTH);
              goto LAB_00107add;
            }
            lVar15 = 0x309;
            pcVar6 = "File size mismatch between control and LM control\n";
LAB_00107d98:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                    ,lVar15,pcVar6);
            ckd_free(pcVar5);
            ckd_free((void *)0x0);
            bVar1 = true;
          }
        }
        else {
          pcVar6 = fread_line((FILE *)pFVar7,&local_f8);
          if (pcVar6 != (char *)0x0) {
            local_90 = pcVar6;
            pcVar6 = string_trim(pcVar6,STRING_BOTH);
            goto LAB_00107aa2;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x2ff,"File size mismatch between control and MLLR control\n");
          ckd_free(pcVar5);
          ckd_free((void *)0x0);
          bVar1 = true;
        }
LAB_00107e30:
        pFVar8 = local_128;
        __stream = local_120;
        __stream_00 = local_100;
      } while (!bVar1);
      goto LAB_001083c8;
    }
    pFVar8 = fopen(pcVar6,"r");
    if (pFVar8 != (FILE *)0x0) goto LAB_001078f6;
    pcVar5 = "Failed to open LM name control file file %s";
    lVar15 = 0x2d7;
LAB_001079eb:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar15,pcVar5,pcVar6);
  }
  else {
    pFVar7 = fopen(pcVar6,"r");
    if (pFVar7 != (FILE *)0x0) goto LAB_001077f6;
    pcVar5 = "Failed to open MLLR control file file %s";
    lVar15 = 0x2c2;
LAB_00107890:
    local_108 = (FILE *)0x0;
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar15,pcVar5,pcVar6);
  }
  pFVar8 = (FILE *)0x0;
  __stream = (FILE *)0x0;
  __stream_00 = (FILE *)0x0;
LAB_001083c8:
  if (pFVar8 != (FILE *)0x0) {
    fclose(pFVar8);
  }
  pFVar7 = local_110;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  if (local_108 != (FILE *)0x0) {
    fclose(local_108);
  }
  fclose(pFVar7);
  ps_free(ps);
  ps_config_free(config_00);
  return 0;
}

Assistant:

int
main(int32 argc, char *argv[])
{
    ps_decoder_t *ps;
    cmd_ln_t *config;
    char const *ctl;
    FILE *ctlfh;

    config = cmd_ln_parse_r(NULL, ps_args_def, argc, argv, TRUE);

    /* Handle argument file as -argfile. */
    if (config && (ctl = ps_config_str(config, "argfile")) != NULL) {
        config = cmd_ln_parse_file_r(config, ps_args_def, ctl, FALSE);
    }
    
    if (config == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, ps_args_def);
        return 1;
    }

    if ((ctl = ps_config_str(config, "ctl")) == NULL) {
        E_FATAL("-ctl argument not present, nothing to do in batch mode!\n");
    }
    if ((ctlfh = fopen(ctl, "r")) == NULL) {
        E_FATAL_SYSTEM("Failed to open control file '%s'", ctl);
    }

    ps_default_search_args(config);
    if (!(ps = ps_init(config))) {
        ps_config_free(config);
        fclose(ctlfh);
        E_FATAL("PocketSphinx decoder init failed\n");
    }

    process_ctl(ps, config, ctlfh);

    fclose(ctlfh);
    ps_free(ps);
    ps_config_free(config);
    return 0;
}